

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O1

void __thiscall
presolve::HighsPostsolveStack::forcingColumn<HighsTripletListSlice>
          (HighsPostsolveStack *this,HighsInt col,HighsMatrixSlice<HighsTripletListSlice> *colVec,
          double cost,double boundVal,bool atInfiniteUpper,bool colIntegral)

{
  int iVar1;
  pointer pNVar2;
  HighsInt *pHVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  long lVar7;
  undefined7 in_register_00000009;
  undefined3 in_register_00000081;
  double *pdVar8;
  long lVar9;
  int *piVar10;
  size_t position;
  ReductionType local_55;
  HighsInt local_54;
  undefined4 local_50;
  undefined4 local_4c;
  double local_48;
  double local_40;
  double local_38;
  
  local_4c = CONCAT31(in_register_00000081,colIntegral);
  local_50 = (undefined4)CONCAT71(in_register_00000009,atInfiniteUpper);
  pNVar2 = (this->colValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->colValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar2) {
    (this->colValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar2;
  }
  lVar9 = (long)colVec->head;
  local_54 = col;
  local_40 = cost;
  local_38 = boundVal;
  if (lVar9 != -1) {
    pHVar3 = colVec->nodeNext;
    pdVar8 = colVec->nodeValue + lVar9;
    piVar10 = colVec->nodeIndex + lVar9;
    do {
      local_48 = *pdVar8;
      std::
      vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
      ::emplace_back<int&,double>
                ((vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
                  *)&this->colValues,
                 (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + *piVar10,&local_48);
      lVar7 = (long)(int)lVar9;
      lVar9 = (long)pHVar3[lVar7];
      piVar10 = piVar10 + (lVar9 - lVar7);
      pdVar8 = pdVar8 + (lVar9 - lVar7);
    } while (lVar9 != -1);
  }
  pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[local_54];
  pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<char,_std::allocator<char>_>::resize
            (&(this->reductionValues).data,(size_type)(pcVar4 + (0x18 - (long)pcVar5)));
  pcVar6 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(double *)(pcVar4 + ((long)pcVar6 - (long)pcVar5)) = local_40;
  *(double *)(pcVar4 + (long)(pcVar6 + (8 - (long)pcVar5))) = local_38;
  *(int *)(pcVar4 + (long)(pcVar6 + (0x10 - (long)pcVar5))) = iVar1;
  pcVar4[(long)(pcVar6 + (0x14 - (long)pcVar5))] = (char)local_50;
  pcVar4[(long)(pcVar6 + (0x15 - (long)pcVar5))] = (char)local_4c;
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (&this->reductionValues,&this->colValues);
  local_55 = kForcingColumn;
  local_48 = (double)((long)(this->reductionValues).data.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->reductionValues).data.
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  std::
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
  ::emplace_back<presolve::HighsPostsolveStack::ReductionType&,unsigned_long&>
            ((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
              *)&this->reductions,&local_55,(unsigned_long *)&local_48);
  return;
}

Assistant:

void forcingColumn(HighsInt col,
                     const HighsMatrixSlice<ColStorageFormat>& colVec,
                     double cost, double boundVal, bool atInfiniteUpper,
                     bool colIntegral) {
    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(ForcingColumn{cost, boundVal, origColIndex[col],
                                       atInfiniteUpper, colIntegral});
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kForcingColumn);
  }